

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bytes * hexStringToBytes(bytes *__return_storage_ptr__,string *_s)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  uint uVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  pcVar1 = (_s->_M_dataplus)._M_p;
  uVar4 = 0;
  if (*pcVar1 == '0') {
    uVar4 = (uint)(pcVar1[1] == 'x') * 2;
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = (ulong)uVar4;
  uStack_38 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(_s->_M_string_length - uVar5) + 1 >> 1);
  if ((_s->_M_string_length & 1) != 0) {
    uVar4 = uVar4 | 1;
    iVar2 = fromHex((_s->_M_dataplus)._M_p[uVar5]);
    uStack_38 = CONCAT17((char)iVar2,(undefined7)uStack_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&uStack_38 + 7));
  }
  for (; (ulong)uVar4 < _s->_M_string_length; uVar4 = uVar4 + 2) {
    iVar2 = fromHex((_s->_M_dataplus)._M_p[uVar4]);
    iVar3 = fromHex((_s->_M_dataplus)._M_p[uVar4 + 1]);
    uStack_38._0_6_ = CONCAT15((char)iVar3 + (char)(iVar2 << 4),(undefined5)uStack_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&uStack_38 + 5));
  }
  return __return_storage_ptr__;
}

Assistant:

bytes hexStringToBytes(std::string const& _s)
{
	unsigned s = (_s[0] == '0' && _s[1] == 'x') ? 2 : 0;
	std::vector<uint8_t> ret;
	ret.reserve((_s.size() - s + 1) / 2);

	if (_s.size() % 2)
		try
		{
			ret.push_back(fromHex(_s[s++]));
		}
		catch (...)
		{
			ret.push_back(0);
		}
	for (unsigned i = s; i < _s.size(); i += 2)
		try
		{
			ret.push_back((byte)(fromHex(_s[i]) * 16 + fromHex(_s[i + 1])));
		}
		catch (...){
			ret.push_back(0);
		}
	return ret;
}